

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O3

bool __thiscall tsip::open_gps_port(tsip *this,string *port)

{
  pointer pcVar1;
  int iVar2;
  FILE *file;
  tsip *this_00;
  long *local_40 [2];
  long local_30 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)port);
  if (iVar2 == 0) {
    std::__cxx11::string::_M_assign((string *)port);
  }
  iVar2 = std::__cxx11::string::compare((char *)port);
  if (iVar2 == 0) {
    puts("Port must be provided in call or in set_gps_port");
  }
  else {
    pcVar1 = (port->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + port->_M_string_length);
    std::__cxx11::string::_M_assign((string *)&this->gps_port);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    this_00 = (tsip *)(this->gps_port)._M_dataplus._M_p;
    file = fopen((char *)this_00,"r");
    this->file = (FILE *)file;
    if (file != (FILE *)0x0) {
      setup_gps_port(this_00,(FILE *)file);
      this->port_status = true;
      return true;
    }
    open_gps_port();
  }
  return false;
}

Assistant:

bool tsip::open_gps_port(std::string port)
{
	if (port == "") {
		port = gps_port;
	}
	if (port == "") {
		printf("Port must be provided in call or in set_gps_port\n");
		return(false);
	}

	// set the port
	set_gps_port(port);

    file = fopen(gps_port.c_str(), "r");

	if (file != NULL) {
		setup_gps_port(file);
		port_status = true;
		return(true);
	} else {
		printf("Cannot open %s\n", gps_port.c_str());
		perror(gps_port.c_str());
		port_status = false;
        return (false);
	}
    //if(!file) {
		////if open fails - terminate run
        //printf("Cannot open %s\n", gps_port.c_str());
        //return (false);
    //}
	//printf("calling setup\n");
    //setup_gps_port(file);
    //printf("return from setup\n");
    //return(true);
}